

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_> *pFVar4;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar5;
  value_type vVar6;
  double dVar7;
  value_type vVar8;
  double dVar9;
  double dVar10;
  
  vVar6 = FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar2 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar7 = cosh((((pFVar2->fadexpr_).left_)->val_ - (double)(pFVar2->fadexpr_).right_.constant_) *
               ((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_);
  vVar8 = FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>
          ::fastAccessDx(&this->right_->fadexpr_,i);
  pFVar3 = this->left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  dVar1 = ((pFVar4->fadexpr_).left_)->val_;
  dVar9 = cosh((((pFVar4->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar10 = cos(((pFVar5->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((pFVar5->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar10 * (dVar1 / dVar9) * vVar8 + dVar7 * vVar6;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}